

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O3

void UI::PathTracerRightStatus(shared_ptr<PathTracerThread> *path_tracer_thread)

{
  float fVar1;
  long lVar2;
  element_type *peVar3;
  bool bVar4;
  ImGuiStyle *pIVar5;
  float fVar6;
  ImVec2 IVar7;
  double dVar8;
  char buf [128];
  char local_98 [136];
  
  fVar6 = ImGui::GetWindowContentRegionWidth();
  pIVar5 = ImGui::GetStyle();
  fVar1 = (pIVar5->ItemSpacing).x;
  sprintf(local_98,"SPP %u",
          (ulong)((path_tracer_thread->
                  super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_spp);
  IVar7 = ImGui::CalcTextSize(local_98,(char *)0x0,false,-1.0);
  fVar6 = fVar6 - IVar7.x;
  ImGui::SameLine(fVar6,-1.0);
  ImGui::TextUnformatted(local_98,(char *)0x0);
  fVar6 = fVar6 - fVar1;
  ImGui::SameLine(fVar6,-1.0);
  ImGui::Separator();
  lVar2 = (long)(((((path_tracer_thread->
                    super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  m_path_tracer_viewer_ptr).
                  super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_path_tracer_ptr).super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  sprintf(local_98,anon_var_dwarf_2163f4,(ulong)*(uint *)(lVar2 + 0x1a8),
          (ulong)*(uint *)(lVar2 + 0x1ac));
  IVar7 = ImGui::CalcTextSize(local_98,(char *)0x0,false,-1.0);
  fVar6 = fVar6 - (IVar7.x + fVar1);
  ImGui::SameLine(fVar6,-1.0);
  ImGui::TextUnformatted(local_98,(char *)0x0);
  bVar4 = ImGui::IsItemHovered(0);
  if (bVar4) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted("Resolution",(char *)0x0);
    ImGui::EndTooltip();
  }
  sprintf(local_98,anon_var_dwarf_216420,
          (ulong)*(uint *)((long)(((((path_tracer_thread->
                                     super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->m_path_tracer_viewer_ptr).
                                   super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->m_path_tracer_ptr).
                                 super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                          0x1b0));
  IVar7 = ImGui::CalcTextSize(local_98,(char *)0x0,false,-1.0);
  fVar6 = fVar6 - (IVar7.x + fVar1);
  ImGui::SameLine(fVar6,-1.0);
  ImGui::TextUnformatted(local_98,(char *)0x0);
  bVar4 = ImGui::IsItemHovered(0);
  if (bVar4) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted("Bounce",(char *)0x0);
    ImGui::EndTooltip();
  }
  dVar8 = PathTracerThread::GetRenderTime
                    ((path_tracer_thread->
                     super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  sprintf(local_98,anon_var_dwarf_216434,(long)dVar8);
  IVar7 = ImGui::CalcTextSize(local_98,(char *)0x0,false,-1.0);
  fVar6 = fVar6 - (IVar7.x + fVar1);
  ImGui::SameLine(fVar6,-1.0);
  ImGui::TextUnformatted(local_98,(char *)0x0);
  bVar4 = ImGui::IsItemHovered(0);
  if (bVar4) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted("Render Time",(char *)0x0);
    ImGui::EndTooltip();
  }
  peVar3 = (path_tracer_thread->super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (((((peVar3->m_path_tracer_queue).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->m_unique_queue_ptr).
       super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_family_index ==
      ((((peVar3->m_main_queue).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
       ->m_unique_queue_ptr).super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->m_family_index) {
    IVar7 = ImGui::CalcTextSize(anon_var_dwarf_216454,(char *)0x0,false,-1.0);
    ImGui::SameLine(fVar6 - (fVar1 + IVar7.x),-1.0);
    ImGui::TextUnformatted(anon_var_dwarf_216454,(char *)0x0);
    bVar4 = ImGui::IsItemHovered(0);
    if (bVar4) {
      ImGui::BeginTooltip();
      ImGui::TextUnformatted("Async path tracing queue not available",(char *)0x0);
      ImGui::EndTooltip();
    }
  }
  return;
}

Assistant:

void PathTracerRightStatus(const std::shared_ptr<PathTracerThread> &path_tracer_thread) {
	float indent_w = ImGui::GetWindowContentRegionWidth(), spacing = ImGui::GetStyle().ItemSpacing.x;
	char buf[128];

	sprintf(buf, "SPP %u", path_tracer_thread->GetSPP());
	indent_w -= ImGui::CalcTextSize(buf).x;
	ImGui::SameLine(indent_w);
	ImGui::TextUnformatted(buf);

	indent_w -= spacing;
	ImGui::SameLine(indent_w);
	ImGui::Separator();

	sprintf(buf, ICON_FA_IMAGE " %ux%u", path_tracer_thread->GetPathTracerViewerPtr()->GetPathTracerPtr()->m_width,
	        path_tracer_thread->GetPathTracerViewerPtr()->GetPathTracerPtr()->m_height);
	indent_w -= ImGui::CalcTextSize(buf).x + spacing;
	ImGui::SameLine(indent_w);
	ImGui::TextUnformatted(buf);

	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Resolution");
		ImGui::EndTooltip();
	}

	sprintf(buf, ICON_FA_BOLT " %u", path_tracer_thread->GetPathTracerViewerPtr()->GetPathTracerPtr()->m_bounce);
	indent_w -= ImGui::CalcTextSize(buf).x + spacing;
	ImGui::SameLine(indent_w);
	ImGui::TextUnformatted(buf);

	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Bounce");
		ImGui::EndTooltip();
	}

	sprintf(buf, ICON_FA_STOPWATCH " %u sec", uint32_t(path_tracer_thread->GetRenderTime()));
	indent_w -= ImGui::CalcTextSize(buf).x + spacing;
	ImGui::SameLine(indent_w);
	ImGui::TextUnformatted(buf);

	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Render Time");
		ImGui::EndTooltip();
	}

	if (path_tracer_thread->GetPathTracerQueue()->GetFamilyIndex() ==
	    path_tracer_thread->GetMainQueue()->GetFamilyIndex()) {
		indent_w -= ImGui::CalcTextSize(ICON_FA_EXCLAMATION_TRIANGLE).x + spacing;
		ImGui::SameLine(indent_w);
		ImGui::TextUnformatted(ICON_FA_EXCLAMATION_TRIANGLE);

		if (ImGui::IsItemHovered()) {
			ImGui::BeginTooltip();
			ImGui::TextUnformatted("Async path tracing queue not available");
			ImGui::EndTooltip();
		}
	}
}